

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Op op,int nbQubits,
          vector<double,_std::allocator<double>_> *vector,int offset)

{
  int iVar1;
  int target_00;
  int iVar2;
  int iVar3;
  int controlState;
  reference pvVar4;
  undefined4 extraout_var;
  double *vector_00;
  SquareMatrix<double> local_90;
  undefined1 local_80 [8];
  anon_class_40_5_d6c92a71 f;
  int target;
  undefined1 local_40 [4];
  int control;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<double,_std::allocator<double>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QControlledGate2<double> *this_local;
  
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = offset;
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])();
  iVar3 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  iVar1 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  *pvVar4 = *pvVar4 + iVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  *pvVar4 = *pvVar4 + iVar1;
  iVar2 = QControlledGate2<double>::control(this);
  iVar2 = iVar2 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar3 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
  f.m22._0_4_ = iVar3 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar3 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))(&local_90);
  vector_00 = std::vector<double,_std::allocator<double>_>::data(vector);
  lambda_QGate1<double>((anon_class_40_5_d6c92a71 *)local_80,op,&local_90,vector_00);
  dense::SquareMatrix<double>::~SquareMatrix(&local_90);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  iVar3 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  target_00 = f.m22._0_4_;
  iVar1 = *pvVar4;
  controlState = QControlledGate2<double>::controlState(this);
  apply4<qclab::qgates::lambda_QGate1<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar3,iVar1,iVar2,target_00,controlState,(anon_class_40_5_d6c92a71 *)local_80)
  ;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Op op ,
                                     const int nbQubits ,
                                     std::vector< T >& vector ,
                                     const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_QGate1( op , this->gate()->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }